

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac_next_cuesheet_track
                    (ma_dr_flac_cuesheet_track_iterator *pIter,
                    ma_dr_flac_cuesheet_track *pCuesheetTrack)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  uint *puVar7;
  undefined8 uVar8;
  ma_uint64 offsetLo;
  ma_uint64 offsetHi;
  char *pRunningData;
  ma_dr_flac_cuesheet_track cuesheetTrack;
  ma_dr_flac_cuesheet_track *pCuesheetTrack_local;
  ma_dr_flac_cuesheet_track_iterator *pIter_local;
  ma_bool32 local_1c;
  
  if (((pIter == (ma_dr_flac_cuesheet_track_iterator *)0x0) || (pIter->countRemaining == 0)) ||
     (pIter->pRunningData == (char *)0x0)) {
    local_1c = 0;
  }
  else {
    puVar7 = (uint *)pIter->pRunningData;
    uVar4 = *puVar7;
    uVar5 = puVar7[1];
    uVar8 = *(undefined8 *)(puVar7 + 2);
    cuesheetTrack.ISRC[7] = (char)((ulong)*(undefined8 *)((long)puVar7 + 9) >> 0x38);
    uVar6 = *(undefined4 *)((long)puVar7 + 0x11);
    bVar1 = *(byte *)((long)puVar7 + 0x15);
    bVar2 = *(byte *)((long)puVar7 + 0x15);
    bVar3 = *(byte *)((long)puVar7 + 0x23);
    pIter->pRunningData = (char *)((ma_dr_flac_cuesheet_track_index *)(puVar7 + 9) + bVar3);
    pIter->countRemaining = pIter->countRemaining - 1;
    if (pCuesheetTrack != (ma_dr_flac_cuesheet_track *)0x0) {
      pCuesheetTrack->offset =
           CONCAT44(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18,
                    uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18)
      ;
      pCuesheetTrack->trackNumber = (char)uVar8;
      pCuesheetTrack->ISRC[0] = (char)((ulong)uVar8 >> 8);
      pCuesheetTrack->ISRC[1] = (char)((ulong)uVar8 >> 0x10);
      pCuesheetTrack->ISRC[2] = (char)((ulong)uVar8 >> 0x18);
      pCuesheetTrack->ISRC[3] = (char)((ulong)uVar8 >> 0x20);
      pCuesheetTrack->ISRC[4] = (char)((ulong)uVar8 >> 0x28);
      pCuesheetTrack->ISRC[5] = (char)((ulong)uVar8 >> 0x30);
      pCuesheetTrack->ISRC[6] = (char)((ulong)uVar8 >> 0x38);
      *(ulong *)(pCuesheetTrack->ISRC + 7) =
           CONCAT17(bVar3,CONCAT16((bVar2 & 0x40) != 0,
                                   CONCAT15(((int)(char)bVar1 & 0x80U) != 0,
                                            CONCAT41(uVar6,cuesheetTrack.ISRC[7]))));
      pCuesheetTrack->pIndexPoints = (ma_dr_flac_cuesheet_track_index *)(puVar7 + 9);
    }
    local_1c = 1;
  }
  return local_1c;
}

Assistant:

MA_API ma_bool32 ma_dr_flac_next_cuesheet_track(ma_dr_flac_cuesheet_track_iterator* pIter, ma_dr_flac_cuesheet_track* pCuesheetTrack)
{
    ma_dr_flac_cuesheet_track cuesheetTrack;
    const char* pRunningData;
    ma_uint64 offsetHi;
    ma_uint64 offsetLo;
    if (pIter == NULL || pIter->countRemaining == 0 || pIter->pRunningData == NULL) {
        return MA_FALSE;
    }
    pRunningData = pIter->pRunningData;
    offsetHi                   = ma_dr_flac__be2host_32(*(const ma_uint32*)pRunningData); pRunningData += 4;
    offsetLo                   = ma_dr_flac__be2host_32(*(const ma_uint32*)pRunningData); pRunningData += 4;
    cuesheetTrack.offset       = offsetLo | (offsetHi << 32);
    cuesheetTrack.trackNumber  = pRunningData[0];                                         pRunningData += 1;
    MA_DR_FLAC_COPY_MEMORY(cuesheetTrack.ISRC, pRunningData, sizeof(cuesheetTrack.ISRC));     pRunningData += 12;
    cuesheetTrack.isAudio      = (pRunningData[0] & 0x80) != 0;
    cuesheetTrack.preEmphasis  = (pRunningData[0] & 0x40) != 0;                           pRunningData += 14;
    cuesheetTrack.indexCount   = pRunningData[0];                                         pRunningData += 1;
    cuesheetTrack.pIndexPoints = (const ma_dr_flac_cuesheet_track_index*)pRunningData;        pRunningData += cuesheetTrack.indexCount * sizeof(ma_dr_flac_cuesheet_track_index);
    pIter->pRunningData = pRunningData;
    pIter->countRemaining -= 1;
    if (pCuesheetTrack) {
        *pCuesheetTrack = cuesheetTrack;
    }
    return MA_TRUE;
}